

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O0

void __thiscall
NLReaderTest_NoNewlineAtEOF_Test::~NLReaderTest_NoNewlineAtEOF_Test
          (NLReaderTest_NoNewlineAtEOF_Test *this)

{
  void *in_RDI;
  
  ~NLReaderTest_NoNewlineAtEOF_Test((NLReaderTest_NoNewlineAtEOF_Test *)0x1a5268);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(NLReaderTest, NoNewlineAtEOF) {
  TestNLHandler handler;
  EXPECT_THROW_MSG(ReadNLString("g\n"
    " 1 1 0\n"
    " 0 0\n"
    " 0 0\n"
    " 0 0 0\n"
    " 0 0 0 1\n"
    " 0 0 0 0 0\n"
    " 0 0\n"
    " 0 0\n"
    " 0 0 0 0 0\n"
    "b\0deadbeef", handler),
      ReadError, "(input):11:2: expected newline");
}